

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printOperand(MCInst *MI,int opNum,SStream *O)

{
  cs_detail *pcVar1;
  _Bool _Var2;
  uint RegNo;
  sparc_reg sVar3;
  int32_t iVar4;
  MCOperand *op;
  uint8_t *puVar5;
  int64_t iVar6;
  MCOperand *MO;
  uint reg;
  int Imm;
  SStream *O_local;
  int opNum_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,opNum);
  _Var2 = MCOperand_isReg(op);
  if (_Var2) {
    RegNo = MCOperand_getReg(op);
    printRegName(O,RegNo);
    sVar3 = Sparc_map_register(RegNo);
    if (MI->csh->detail != CS_OPT_OFF) {
      if ((MI->csh->doing_mem & 1U) == 0) {
        puVar5 = MI->flat_insn->detail->groups +
                 (ulong)(MI->flat_insn->detail->field_6).x86.rex * 0xc + 0x1a;
        puVar5[0] = '\x01';
        puVar5[1] = '\0';
        puVar5[2] = '\0';
        puVar5[3] = '\0';
        *(sparc_reg *)
         (MI->flat_insn->detail->groups +
         (ulong)(MI->flat_insn->detail->field_6).x86.rex * 0xc + 0x1e) = sVar3;
        pcVar1 = MI->flat_insn->detail;
        (pcVar1->field_6).x86.rex = (pcVar1->field_6).x86.rex + '\x01';
      }
      else if (MI->flat_insn->detail->groups
               [(ulong)(MI->flat_insn->detail->field_6).x86.rex * 0xc + 0x1e] == '\0') {
        MI->flat_insn->detail->groups[(ulong)(MI->flat_insn->detail->field_6).x86.rex * 0xc + 0x1e]
             = (uint8_t)sVar3;
      }
      else {
        MI->flat_insn->detail->groups[(ulong)(MI->flat_insn->detail->field_6).x86.rex * 0xc + 0x1f]
             = (uint8_t)sVar3;
      }
    }
  }
  else {
    _Var2 = MCOperand_isImm(op);
    if (_Var2) {
      iVar6 = MCOperand_getImm(op);
      MO._4_4_ = (uint32_t)iVar6;
      switch(MI->Opcode) {
      case 0x47:
      case 0x48:
      case 0x49:
      case 0x95:
      case 0x96:
        iVar4 = SignExtend32(MO._4_4_,0x16);
        MO._4_4_ = (int)MI->address + iVar4 * 4;
        break;
      case 0x4d:
      case 0x4e:
      case 0x4f:
      case 0x50:
      case 0x59:
      case 0x5a:
      case 0x5b:
      case 0x5c:
      case 0x69:
      case 0x6a:
      case 0x6b:
      case 0x6c:
        iVar4 = SignExtend32(MO._4_4_,0x13);
        MO._4_4_ = (int)MI->address + iVar4 * 4;
        break;
      case 0x51:
      case 0x52:
      case 0x53:
      case 0x54:
      case 0x55:
      case 0x56:
      case 0x57:
      case 0x58:
      case 0x5d:
      case 0x5e:
      case 0x5f:
      case 0x60:
      case 0x61:
      case 0x62:
      case 99:
      case 100:
      case 0x65:
      case 0x66:
      case 0x67:
      case 0x68:
      case 0x6d:
      case 0x6e:
      case 0x6f:
      case 0x70:
        iVar4 = SignExtend32(MO._4_4_,0x10);
        MO._4_4_ = (int)MI->address + iVar4 * 4;
        break;
      case 0x72:
        iVar4 = SignExtend32(MO._4_4_,0x1e);
        MO._4_4_ = (int)MI->address + iVar4;
      }
      if ((int)MO._4_4_ < 0) {
        if ((int)MO._4_4_ < -9) {
          SStream_concat(O,"-0x%x",(ulong)-MO._4_4_);
        }
        else {
          SStream_concat(O,"-%u",(ulong)-MO._4_4_);
        }
      }
      else if ((int)MO._4_4_ < 10) {
        SStream_concat(O,"%u",(ulong)MO._4_4_);
      }
      else {
        SStream_concat(O,"0x%x",(ulong)MO._4_4_);
      }
      if (MI->csh->detail != CS_OPT_OFF) {
        if ((MI->csh->doing_mem & 1U) == 0) {
          puVar5 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.rex * 0xc + 0x1a;
          puVar5[0] = '\x02';
          puVar5[1] = '\0';
          puVar5[2] = '\0';
          puVar5[3] = '\0';
          *(uint32_t *)
           (MI->flat_insn->detail->groups +
           (ulong)(MI->flat_insn->detail->field_6).x86.rex * 0xc + 0x1e) = MO._4_4_;
          pcVar1 = MI->flat_insn->detail;
          (pcVar1->field_6).x86.rex = (pcVar1->field_6).x86.rex + '\x01';
        }
        else {
          *(uint32_t *)
           (MI->flat_insn->detail->groups +
           (ulong)(MI->flat_insn->detail->field_6).x86.rex * 0xc + 0x22) = MO._4_4_;
        }
      }
    }
  }
  return;
}

Assistant:

static void printOperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	int32_t imm;
	MCOperand *Op = MCInst_getOperand(MI, OpNo);
	if (MCOperand_isReg(Op)) {
		unsigned Reg = MCOperand_getReg(Op);
		printRegName(MI->csh, O, Reg);
		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				if (MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.base == ARM_REG_INVALID)
					MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.base = Reg;
				else
					MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.index = Reg;
			} else {
				MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
				MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = Reg;
				MI->flat_insn->detail->arm.op_count++;
			}
		}
	} else if (MCOperand_isImm(Op)) {
		unsigned int opc = MCInst_getOpcode(MI);

		imm = (int32_t)MCOperand_getImm(Op);

		// relative branch only has relative offset, so we have to update it
		// to reflect absolute address. 
		// Note: in ARM, PC is always 2 instructions ahead, so we have to
		// add 8 in ARM mode, or 4 in Thumb mode
		// printf(">> opcode: %u\n", MCInst_getOpcode(MI));
		if (ARM_rel_branch(MI->csh, opc)) {
			// only do this for relative branch
			if (MI->csh->mode & CS_MODE_THUMB) {
				imm += (int32_t)MI->address + 4;
				if (ARM_blx_to_arm_mode(MI->csh, opc)) {
					// here need to align down to the nearest 4-byte address
#define _ALIGN_DOWN(v, align_width) ((v/align_width)*align_width)
					imm = _ALIGN_DOWN(imm, 4);
#undef _ALIGN_DOWN
				}
			} else {
				imm += (int32_t)MI->address + 8;
			}

			if (imm >= 0) {
				if (imm > HEX_THRESHOLD)
					SStream_concat(O, "#0x%x", imm);
				else
					SStream_concat(O, "#%u", imm);
			} else {
				SStream_concat(O, "#0x%x", imm);
			}
		} else {
			switch(MI->flat_insn->id) {
				default:
					if (imm >= 0) {
						if (imm > HEX_THRESHOLD)
							SStream_concat(O, "#0x%x", imm);
						else
							SStream_concat(O, "#%u", imm);
					} else {
						if (imm < -HEX_THRESHOLD)
							SStream_concat(O, "#-0x%x", -imm);
						else
							SStream_concat(O, "#-%u", -imm);
					}
					break;
				case ARM_INS_AND:
				case ARM_INS_ORR:
				case ARM_INS_EOR:
				case ARM_INS_BIC:
				case ARM_INS_MVN:
					// do not print number in negative form
					if (imm >= 0 && imm <= HEX_THRESHOLD)
						SStream_concat(O, "#%u", imm);
					else
						SStream_concat(O, "#0x%x", imm);
					break;
			}
		}

		if (MI->csh->detail) {
			if (MI->csh->doing_mem)
				MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.disp = imm;
			else {
				MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_IMM;
				MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].imm = imm;
				MI->flat_insn->detail->arm.op_count++;
			}
		}
	}
}